

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O3

Result_Type *
chaiscript::detail::Cast_Helper_Inner<henson::Array>::cast
          (Result_Type *__return_storage_ptr__,Boxed_Value *ob,Type_Conversions_State *param_2)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  undefined8 *puVar6;
  bad_any_cast *this;
  
  bVar5 = Type_Info::bare_equal_type_info
                    (&((ob->m_data).
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_type_info,(type_info *)&henson::Array::typeinfo);
  if (bVar5) {
    puVar6 = (undefined8 *)
             throw_if_null<void_const>
                       (((ob->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_const_data_ptr);
    uVar2 = puVar6[1];
    sVar3 = puVar6[2];
    sVar4 = puVar6[3];
    *(undefined8 *)
     &(__return_storage_ptr__->address).impl_.
      super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
      .
      super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
      .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
      super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
      .
      super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
         = *puVar6;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->address).impl_.
             super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
             .
             super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
             .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
             super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
             .
             super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
     + 8) = uVar2;
    __return_storage_ptr__->type = sVar3;
    __return_storage_ptr__->count = sVar4;
    __return_storage_ptr__->stride = puVar6[4];
    (__return_storage_ptr__->storage).
    super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)puVar6[5];
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar6[6];
    (__return_storage_ptr__->storage).
    super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var1;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
    return __return_storage_ptr__;
  }
  this = (bad_any_cast *)__cxa_allocate_exception(0x28);
  exception::bad_any_cast::bad_any_cast(this);
  __cxa_throw(this,&exception::bad_any_cast::typeinfo,exception::bad_any_cast::~bad_any_cast);
}

Assistant:

static Result_Type cast(const Boxed_Value &ob, const Type_Conversions_State *)
        {
          if (ob.get_type_info().bare_equal_type_info(typeid(Result)))
          {
            auto p = throw_if_null(ob.get_const_ptr());
            return *static_cast<const Result *>(p);
          } else {
            throw chaiscript::detail::exception::bad_any_cast();
          }
        }